

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

qint64 __thiscall QDateTime::msecsTo(QDateTime *this,QDateTime *other)

{
  QDateTimePrivate *pQVar1;
  qint64 qVar2;
  qint64 qVar3;
  
  pQVar1 = (this->d).d;
  if (((ulong)pQVar1 & 1) == 0) {
    pQVar1 = (QDateTimePrivate *)
             (ulong)(pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if (((ulong)pQVar1 & 8) != 0) {
    pQVar1 = (other->d).d;
    if (((ulong)pQVar1 & 1) == 0) {
      pQVar1 = (QDateTimePrivate *)
               (ulong)(pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if (((ulong)pQVar1 & 8) != 0) {
      qVar2 = toMSecsSinceEpoch(other);
      qVar3 = toMSecsSinceEpoch(this);
      return qVar2 - qVar3;
    }
  }
  return 0;
}

Assistant:

qint64 QDateTime::msecsTo(const QDateTime &other) const
{
    if (!isValid() || !other.isValid())
        return 0;

    return other.toMSecsSinceEpoch() - toMSecsSinceEpoch();
}